

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::StrPair::GetStr(StrPair *this)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  long lVar4;
  undefined4 extraout_var;
  size_t __n;
  ulong uVar5;
  char *p;
  char *__dest;
  bool bVar6;
  int len;
  char buf [10];
  int local_4c;
  char local_48 [16];
  undefined8 local_38;
  
  if ((this->_flags & 0x100) != 0) {
    *this->_end = '\0';
    uVar2 = this->_flags;
    this->_flags = uVar2 ^ 0x100;
    if (uVar2 != 0x100) {
      p = this->_start;
      __dest = p;
      if (p < this->_end) {
        do {
          uVar2 = this->_flags;
          if ((uVar2 & 2) == 0) {
LAB_0011751b:
            if (((uVar2 & 1) == 0) || (*p != '&')) {
              *__dest = *p;
              pcVar3 = p + 1;
              goto LAB_001175aa;
            }
            if (p[1] == '#') {
              local_48[8] = '\0';
              local_48[9] = '\0';
              local_48[0] = '\0';
              local_48[1] = '\0';
              local_48[2] = '\0';
              local_48[3] = '\0';
              local_48[4] = '\0';
              local_48[5] = '\0';
              local_48[6] = '\0';
              local_48[7] = '\0';
              local_4c = 0;
              pcVar3 = XMLUtil::GetCharacterRef(p,local_48,&local_4c);
              if (pcVar3 == (char *)0x0) {
                pcVar3 = p + 1;
                *__dest = *p;
                lVar4 = 1;
              }
              else {
                memcpy(__dest,local_48,(long)local_4c);
                lVar4 = (long)local_4c;
              }
              __dest = __dest + lVar4;
            }
            else {
              pcVar3 = "\"";
              local_38 = 0;
              uVar5 = 0;
              do {
                __n = (size_t)*(int *)(pcVar3 + -4);
                iVar1 = strncmp(p + 1,*(char **)(pcVar3 + -0xc),__n);
                bVar6 = true;
                if ((iVar1 == 0) && (p[__n + 1] == ';')) {
                  *__dest = *pcVar3;
                  __dest = __dest + 1;
                  p = p + __n + 2;
                  local_38 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),1);
                  bVar6 = false;
                }
                if (!bVar6) break;
                pcVar3 = pcVar3 + 0x10;
                bVar6 = uVar5 < 4;
                uVar5 = uVar5 + 1;
              } while (bVar6);
              uVar2 = (byte)~(byte)local_38 & 1;
              __dest = __dest + uVar2;
              pcVar3 = p + uVar2;
            }
          }
          else {
            if (*p == '\r') {
              bVar6 = p[1] == '\n';
            }
            else {
              if (((uVar2 & 2) == 0) || (*p != '\n')) goto LAB_0011751b;
              bVar6 = p[1] == '\r';
            }
            pcVar3 = p + 1;
            if (bVar6) {
              pcVar3 = p + 2;
            }
            *__dest = '\n';
LAB_001175aa:
            __dest = __dest + 1;
          }
          p = pcVar3;
        } while (pcVar3 < this->_end);
      }
      *__dest = '\0';
    }
    if ((this->_flags & 4) != 0) {
      CollapseWhitespace(this);
    }
    this->_flags = this->_flags & 0x200;
  }
  return this->_start;
}

Assistant:

const char* StrPair::GetStr()
{
    TIXMLASSERT( _start );
    TIXMLASSERT( _end );
    if ( _flags & NEEDS_FLUSH ) {
        *_end = 0;
        _flags ^= NEEDS_FLUSH;

        if ( _flags ) {
            const char* p = _start;	// the read pointer
            char* q = _start;	// the write pointer

            while( p < _end ) {
                if ( (_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == CR ) {
                    // CR-LF pair becomes LF
                    // CR alone becomes LF
                    // LF-CR becomes LF
                    if ( *(p+1) == LF ) {
                        p += 2;
                    }
                    else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                }
                else if ( (_flags & NEEDS_NEWLINE_NORMALIZATION) && *p == LF ) {
                    if ( *(p+1) == CR ) {
                        p += 2;
                    }
                    else {
                        ++p;
                    }
                    *q = LF;
                    ++q;
                }
                else if ( (_flags & NEEDS_ENTITY_PROCESSING) && *p == '&' ) {
                    // Entities handled by tinyXML2:
                    // - special entities in the entity table [in/out]
                    // - numeric character reference [in]
                    //   &#20013; or &#x4e2d;

                    if ( *(p+1) == '#' ) {
                        const int buflen = 10;
                        char buf[buflen] = { 0 };
                        int len = 0;
                        const char* adjusted = const_cast<char*>( XMLUtil::GetCharacterRef( p, buf, &len ) );
                        if ( adjusted == 0 ) {
                            *q = *p;
                            ++p;
                            ++q;
                        }
                        else {
                            TIXMLASSERT( 0 <= len && len <= buflen );
                            TIXMLASSERT( q + len <= adjusted );
                            p = adjusted;
                            memcpy( q, buf, len );
                            q += len;
                        }
                    }
                    else {
                        bool entityFound = false;
                        for( int i = 0; i < NUM_ENTITIES; ++i ) {
                            const Entity& entity = entities[i];
                            if ( strncmp( p + 1, entity.pattern, entity.length ) == 0
                                    && *( p + entity.length + 1 ) == ';' ) {
                                // Found an entity - convert.
                                *q = entity.value;
                                ++q;
                                p += entity.length + 2;
                                entityFound = true;
                                break;
                            }
                        }
                        if ( !entityFound ) {
                            // fixme: treat as error?
                            ++p;
                            ++q;
                        }
                    }
                }
                else {
                    *q = *p;
                    ++p;
                    ++q;
                }
            }
            *q = 0;
        }
        // The loop below has plenty going on, and this
        // is a less useful mode. Break it out.
        if ( _flags & NEEDS_WHITESPACE_COLLAPSING ) {
            CollapseWhitespace();
        }
        _flags = (_flags & NEEDS_DELETE);
    }
    TIXMLASSERT( _start );
    return _start;
}